

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

uv_handle_type uv_pipe_pending_type(uv_pipe_t *handle)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int aiStack_120 [2];
  sockaddr asStack_118 [8];
  stat64 sStack_98;
  
  if ((handle->ipc == 0) || (iVar2 = handle->accepted_fd, iVar2 == -1)) {
    return UV_UNKNOWN_HANDLE;
  }
  if (iVar2 < 0) {
    return UV_UNKNOWN_HANDLE;
  }
  iVar1 = isatty(iVar2);
  if (iVar1 == 0) {
    iVar1 = fstat64(iVar2,&sStack_98);
    if (iVar1 == 0) {
      uVar3 = sStack_98.st_mode & 0xf000;
      if (uVar3 < 0x8000) {
        if (uVar3 == 0x1000) {
          return UV_NAMED_PIPE;
        }
        if (uVar3 == 0x2000) {
          return UV_FILE;
        }
      }
      else {
        if (uVar3 == 0x8000) {
          return UV_FILE;
        }
        if (uVar3 == 0xc000) {
          aiStack_120[1] = 0x80;
          iVar1 = getsockname(iVar2,asStack_118,(socklen_t *)(aiStack_120 + 1));
          if (iVar1 == 0) {
            aiStack_120[1] = 4;
            iVar2 = getsockopt(iVar2,1,3,aiStack_120,(socklen_t *)(aiStack_120 + 1));
            if (iVar2 == 0) {
              if (aiStack_120[0] == 1) {
                if ((asStack_118[0].sa_family & 0xfff7) == 2) {
                  return UV_TCP;
                }
                if (asStack_118[0].sa_family == 1) {
                  return UV_NAMED_PIPE;
                }
              }
              else if ((aiStack_120[0] == 2) && ((asStack_118[0].sa_family & 0xfff7) == 2)) {
                return UV_UDP;
              }
            }
          }
        }
      }
    }
    return UV_UNKNOWN_HANDLE;
  }
  return UV_TTY;
}

Assistant:

uv_handle_type uv_pipe_pending_type(uv_pipe_t* handle) {
  if (!handle->ipc)
    return UV_UNKNOWN_HANDLE;

  if (handle->accepted_fd == -1)
    return UV_UNKNOWN_HANDLE;
  else
    return uv_guess_handle(handle->accepted_fd);
}